

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void add_intrinsic_mul(Context_conflict *ctx,char *fn)

{
  MOJOSHADER_astDataType *ret;
  MOJOSHADER_astDataType *dt2;
  MOJOSHADER_astDataType *dt2_00;
  MOJOSHADER_astDataType *dt2_01;
  MOJOSHADER_astDataType *ret_00;
  MOJOSHADER_astDataType *ret_01;
  MOJOSHADER_astDataType *ret_02;
  MOJOSHADER_astDataType *dt2_02;
  MOJOSHADER_astDataType *dt2_03;
  MOJOSHADER_astDataType *dt2_04;
  MOJOSHADER_astDataType *dt1;
  MOJOSHADER_astDataType *dt1_00;
  MOJOSHADER_astDataType *ret_03;
  MOJOSHADER_astDataType *ret_04;
  MOJOSHADER_astDataType *ret_05;
  MOJOSHADER_astDataType *dt2_05;
  MOJOSHADER_astDataType *dt2_06;
  MOJOSHADER_astDataType *dt2_07;
  MOJOSHADER_astDataType *dt2_08;
  MOJOSHADER_astDataType *dt2_09;
  MOJOSHADER_astDataType *dt2_10;
  MOJOSHADER_astDataType *dt2_11;
  MOJOSHADER_astDataType *dt2_12;
  MOJOSHADER_astDataType *dt2_13;
  MOJOSHADER_astDataType *ret_06;
  MOJOSHADER_astDataType *dt1_01;
  MOJOSHADER_astDataType *dt1_02;
  MOJOSHADER_astDataType *dt1_03;
  MOJOSHADER_astDataType *dt1_04;
  MOJOSHADER_astDataType *dt1_05;
  MOJOSHADER_astDataType *dt1_06;
  MOJOSHADER_astDataType *dt1_07;
  MOJOSHADER_astDataType *dt1_08;
  MOJOSHADER_astDataType *dt2_14;
  MOJOSHADER_astDataType *dt2_15;
  MOJOSHADER_astDataType *dt2_16;
  MOJOSHADER_astDataType *dt2_17;
  MOJOSHADER_astDataType *ret_07;
  MOJOSHADER_astDataType *ret_08;
  MOJOSHADER_astDataType *ret_09;
  MOJOSHADER_astDataType *dt1_09;
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_astDataType *pMVar2;
  
  ret = &ctx->dt_float;
  pMVar2 = &ctx->dt_int;
  dt2 = get_usertype(ctx,"float1");
  dt2_00 = get_usertype(ctx,"float2");
  dt2_01 = get_usertype(ctx,"float3");
  ret_00 = get_usertype(ctx,"float4");
  ret_01 = get_usertype(ctx,"int1");
  ret_02 = get_usertype(ctx,"int2");
  dt2_02 = get_usertype(ctx,"int3");
  dt2_03 = get_usertype(ctx,"int4");
  dt2_04 = get_usertype(ctx,"float1x1");
  dt1 = get_usertype(ctx,"float1x2");
  dt1_00 = get_usertype(ctx,"float1x3");
  ret_03 = get_usertype(ctx,"float1x4");
  ret_04 = get_usertype(ctx,"float2x1");
  ret_05 = get_usertype(ctx,"float2x2");
  dt2_05 = get_usertype(ctx,"float2x3");
  dt2_06 = get_usertype(ctx,"float2x4");
  dt2_07 = get_usertype(ctx,"float3x1");
  dt2_08 = get_usertype(ctx,"float3x2");
  dt2_09 = get_usertype(ctx,"float3x3");
  dt2_10 = get_usertype(ctx,"float3x4");
  dt2_11 = get_usertype(ctx,"float4x1");
  dt2_12 = get_usertype(ctx,"float4x2");
  dt2_13 = get_usertype(ctx,"float4x3");
  ret_06 = get_usertype(ctx,"float4x4");
  dt1_01 = get_usertype(ctx,"int1x1");
  dt1_02 = get_usertype(ctx,"int1x2");
  dt1_03 = get_usertype(ctx,"int1x3");
  dt1_04 = get_usertype(ctx,"int1x4");
  dt1_05 = get_usertype(ctx,"int2x1");
  dt1_06 = get_usertype(ctx,"int2x2");
  dt1_07 = get_usertype(ctx,"int2x3");
  dt1_08 = get_usertype(ctx,"int2x4");
  dt2_14 = get_usertype(ctx,"int3x1");
  dt2_15 = get_usertype(ctx,"int3x2");
  dt2_16 = get_usertype(ctx,"int3x3");
  dt2_17 = get_usertype(ctx,"int3x4");
  ret_07 = get_usertype(ctx,"int4x1");
  ret_08 = get_usertype(ctx,"int4x2");
  ret_09 = get_usertype(ctx,"int4x3");
  dt1_09 = get_usertype(ctx,"int4x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,pMVar2);
  add_intrinsic2(ctx,fn,ret,ret,ret);
  pMVar1 = get_usertype(ctx,"int1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"float1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"int1x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int1x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int1x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int1x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int2x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int2x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int2x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int2x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int3x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int3x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int3x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int3x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int4x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int4x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int4x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"int4x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar2,pMVar1);
  pMVar1 = get_usertype(ctx,"float1x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float1x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float1x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float1x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float2x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float2x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float2x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float2x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float3x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float3x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float3x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float3x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float4x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float4x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float4x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"float4x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half1x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half1x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half1x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half1x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half2x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half2x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half2x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half2x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half3x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half3x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half3x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half3x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half4x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half4x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half4x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"half4x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double1x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double1x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double1x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double1x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double2x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double2x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double2x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double2x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double3x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double3x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double3x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double3x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double4x1");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double4x2");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double4x3");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"double4x4");
  add_intrinsic2(ctx,fn,pMVar1,ret,pMVar1);
  pMVar1 = get_usertype(ctx,"int1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"float1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"float2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"float3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"float4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"half1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"half2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"half3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"half4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"double1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"double2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"double3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"double4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,ret);
  pMVar1 = get_usertype(ctx,"int1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"int4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"uint4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"float1");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"float2");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"float3");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"float4");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"half1");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"half2");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"half3");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"half4");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"double1");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"double2");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"double3");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  pMVar1 = get_usertype(ctx,"double4");
  add_intrinsic2(ctx,fn,ret,pMVar1,pMVar1);
  add_intrinsic2(ctx,fn,ret_01,ret_01,dt1_01);
  add_intrinsic2(ctx,fn,ret_02,ret_01,dt1_02);
  add_intrinsic2(ctx,fn,dt2_02,ret_01,dt1_03);
  add_intrinsic2(ctx,fn,dt2_03,ret_01,dt1_04);
  add_intrinsic2(ctx,fn,ret_01,ret_02,dt1_05);
  add_intrinsic2(ctx,fn,ret_02,ret_02,dt1_06);
  add_intrinsic2(ctx,fn,dt2_02,ret_02,dt1_07);
  add_intrinsic2(ctx,fn,dt2_03,ret_02,dt1_08);
  add_intrinsic2(ctx,fn,ret_01,dt2_02,dt2_14);
  add_intrinsic2(ctx,fn,ret_02,dt2_02,dt2_15);
  add_intrinsic2(ctx,fn,dt2_02,dt2_02,dt2_16);
  add_intrinsic2(ctx,fn,dt2_03,dt2_02,dt2_17);
  add_intrinsic2(ctx,fn,ret_01,dt2_03,ret_07);
  add_intrinsic2(ctx,fn,ret_02,dt2_03,ret_08);
  add_intrinsic2(ctx,fn,dt2_02,dt2_03,ret_09);
  add_intrinsic2(ctx,fn,dt2_03,dt2_03,dt1_09);
  add_intrinsic2(ctx,fn,dt2,dt2,dt2_04);
  add_intrinsic2(ctx,fn,dt2_00,dt2,dt1);
  add_intrinsic2(ctx,fn,dt2_01,dt2,dt1_00);
  add_intrinsic2(ctx,fn,ret_00,dt2,ret_03);
  add_intrinsic2(ctx,fn,dt2,dt2_00,ret_04);
  add_intrinsic2(ctx,fn,dt2_00,dt2_00,ret_05);
  add_intrinsic2(ctx,fn,dt2_01,dt2_00,dt2_05);
  add_intrinsic2(ctx,fn,ret_00,dt2_00,dt2_06);
  add_intrinsic2(ctx,fn,dt2,dt2_01,dt2_07);
  add_intrinsic2(ctx,fn,dt2_00,dt2_01,dt2_08);
  add_intrinsic2(ctx,fn,dt2_01,dt2_01,dt2_09);
  add_intrinsic2(ctx,fn,ret_00,dt2_01,dt2_10);
  add_intrinsic2(ctx,fn,dt2,ret_00,dt2_11);
  add_intrinsic2(ctx,fn,dt2_00,ret_00,dt2_12);
  add_intrinsic2(ctx,fn,dt2_01,ret_00,dt2_13);
  add_intrinsic2(ctx,fn,ret_00,ret_00,ret_06);
  pMVar1 = get_usertype(ctx,"int1x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int1x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int1x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int1x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int2x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int2x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int2x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int2x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int3x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int3x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int3x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int3x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int4x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int4x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int4x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"int4x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint1x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint1x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint1x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint1x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint2x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint2x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint2x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint2x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint3x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint3x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint3x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint3x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint4x1");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint4x2");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint4x3");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar1 = get_usertype(ctx,"uint4x4");
  add_intrinsic2(ctx,fn,pMVar1,pMVar1,pMVar2);
  pMVar2 = get_usertype(ctx,"float1x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float1x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float1x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float1x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float2x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float2x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float2x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float2x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float3x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float3x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float3x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float3x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float4x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float4x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float4x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"float4x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half1x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half1x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half1x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half1x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half2x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half2x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half2x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half2x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half3x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half3x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half3x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half3x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half4x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half4x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half4x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"half4x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double1x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double1x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double1x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double1x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double2x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double2x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double2x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double2x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double3x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double3x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double3x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double3x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double4x1");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double4x2");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double4x3");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  pMVar2 = get_usertype(ctx,"double4x4");
  add_intrinsic2(ctx,fn,pMVar2,pMVar2,ret);
  add_intrinsic2(ctx,fn,ret_01,dt1_01,ret_01);
  add_intrinsic2(ctx,fn,ret_01,dt1_02,ret_02);
  add_intrinsic2(ctx,fn,ret_01,dt1_03,dt2_02);
  add_intrinsic2(ctx,fn,ret_01,dt1_04,dt2_03);
  add_intrinsic2(ctx,fn,ret_02,dt1_05,ret_01);
  add_intrinsic2(ctx,fn,ret_02,dt1_06,ret_02);
  add_intrinsic2(ctx,fn,ret_02,dt1_07,dt2_02);
  add_intrinsic2(ctx,fn,ret_02,dt1_08,dt2_03);
  add_intrinsic2(ctx,fn,dt2_02,dt2_14,ret_01);
  add_intrinsic2(ctx,fn,dt2_02,dt2_15,ret_02);
  add_intrinsic2(ctx,fn,dt2_02,dt2_16,dt2_02);
  add_intrinsic2(ctx,fn,dt2_02,dt2_17,dt2_03);
  add_intrinsic2(ctx,fn,dt2_03,ret_07,ret_01);
  add_intrinsic2(ctx,fn,dt2_03,ret_08,ret_02);
  add_intrinsic2(ctx,fn,dt2_03,ret_09,dt2_02);
  add_intrinsic2(ctx,fn,dt2_03,dt1_09,dt2_03);
  add_intrinsic2(ctx,fn,dt2,dt2_04,dt2);
  add_intrinsic2(ctx,fn,dt2,dt1,dt2_00);
  add_intrinsic2(ctx,fn,dt2,dt1_00,dt2_01);
  add_intrinsic2(ctx,fn,dt2,ret_03,ret_00);
  add_intrinsic2(ctx,fn,dt2_00,ret_04,dt2);
  add_intrinsic2(ctx,fn,dt2_00,ret_05,dt2_00);
  add_intrinsic2(ctx,fn,dt2_00,dt2_05,dt2_01);
  add_intrinsic2(ctx,fn,dt2_00,dt2_06,ret_00);
  add_intrinsic2(ctx,fn,dt2_01,dt2_07,dt2);
  add_intrinsic2(ctx,fn,dt2_01,dt2_08,dt2_00);
  add_intrinsic2(ctx,fn,dt2_01,dt2_09,dt2_01);
  add_intrinsic2(ctx,fn,dt2_01,dt2_10,ret_00);
  add_intrinsic2(ctx,fn,ret_00,dt2_11,dt2);
  add_intrinsic2(ctx,fn,ret_00,dt2_12,dt2_00);
  add_intrinsic2(ctx,fn,ret_00,dt2_13,dt2_01);
  add_intrinsic2(ctx,fn,ret_00,ret_06,ret_00);
  add_intrinsic2(ctx,fn,dt1_01,dt1_01,dt1_01);
  add_intrinsic2(ctx,fn,dt1_02,dt1_01,dt1_02);
  add_intrinsic2(ctx,fn,dt1_03,dt1_01,dt1_03);
  add_intrinsic2(ctx,fn,dt1_04,dt1_01,dt1_04);
  add_intrinsic2(ctx,fn,dt1_01,dt1_02,dt1_05);
  add_intrinsic2(ctx,fn,dt1_02,dt1_02,dt1_06);
  add_intrinsic2(ctx,fn,dt1_03,dt1_02,dt1_07);
  add_intrinsic2(ctx,fn,dt1_04,dt1_02,dt1_08);
  add_intrinsic2(ctx,fn,dt1_01,dt1_03,dt2_14);
  add_intrinsic2(ctx,fn,dt1_02,dt1_03,dt2_15);
  add_intrinsic2(ctx,fn,dt1_03,dt1_03,dt2_16);
  add_intrinsic2(ctx,fn,dt1_04,dt1_03,dt2_17);
  add_intrinsic2(ctx,fn,dt1_01,dt1_04,ret_07);
  add_intrinsic2(ctx,fn,dt1_02,dt1_04,ret_08);
  add_intrinsic2(ctx,fn,dt1_03,dt1_04,ret_09);
  add_intrinsic2(ctx,fn,dt1_04,dt1_04,dt1_09);
  add_intrinsic2(ctx,fn,dt1_05,dt1_05,dt1_01);
  add_intrinsic2(ctx,fn,dt1_06,dt1_05,dt1_02);
  add_intrinsic2(ctx,fn,dt1_07,dt1_05,dt1_03);
  add_intrinsic2(ctx,fn,dt1_08,dt1_05,dt1_04);
  add_intrinsic2(ctx,fn,dt1_05,dt1_06,dt1_05);
  add_intrinsic2(ctx,fn,dt1_06,dt1_06,dt1_06);
  add_intrinsic2(ctx,fn,dt1_07,dt1_06,dt1_07);
  add_intrinsic2(ctx,fn,dt1_08,dt1_06,dt1_08);
  add_intrinsic2(ctx,fn,dt1_05,dt1_07,dt2_14);
  add_intrinsic2(ctx,fn,dt1_06,dt1_07,dt2_15);
  add_intrinsic2(ctx,fn,dt1_07,dt1_07,dt2_16);
  add_intrinsic2(ctx,fn,dt1_08,dt1_07,dt2_17);
  add_intrinsic2(ctx,fn,dt1_05,dt1_08,ret_07);
  add_intrinsic2(ctx,fn,dt1_06,dt1_08,ret_08);
  add_intrinsic2(ctx,fn,dt1_07,dt1_08,ret_09);
  add_intrinsic2(ctx,fn,dt1_08,dt1_08,dt1_09);
  add_intrinsic2(ctx,fn,dt2_14,dt2_14,dt1_01);
  add_intrinsic2(ctx,fn,dt2_15,dt2_14,dt1_02);
  add_intrinsic2(ctx,fn,dt2_16,dt2_14,dt1_03);
  add_intrinsic2(ctx,fn,dt2_17,dt2_14,dt1_04);
  add_intrinsic2(ctx,fn,dt2_14,dt2_15,dt1_05);
  add_intrinsic2(ctx,fn,dt2_15,dt2_15,dt1_06);
  add_intrinsic2(ctx,fn,dt2_16,dt2_15,dt1_07);
  add_intrinsic2(ctx,fn,dt2_17,dt2_15,dt1_08);
  add_intrinsic2(ctx,fn,dt2_14,dt2_16,dt2_14);
  add_intrinsic2(ctx,fn,dt2_15,dt2_16,dt2_15);
  add_intrinsic2(ctx,fn,dt2_16,dt2_16,dt2_16);
  add_intrinsic2(ctx,fn,dt2_17,dt2_16,dt2_17);
  add_intrinsic2(ctx,fn,dt2_14,dt2_17,ret_07);
  add_intrinsic2(ctx,fn,dt2_15,dt2_17,ret_08);
  add_intrinsic2(ctx,fn,dt2_16,dt2_17,ret_09);
  add_intrinsic2(ctx,fn,dt2_17,dt2_17,dt1_09);
  add_intrinsic2(ctx,fn,ret_07,ret_07,dt1_01);
  add_intrinsic2(ctx,fn,ret_08,ret_07,dt1_02);
  add_intrinsic2(ctx,fn,ret_09,ret_07,dt1_03);
  add_intrinsic2(ctx,fn,dt1_09,ret_07,dt1_04);
  add_intrinsic2(ctx,fn,ret_07,ret_08,dt1_05);
  add_intrinsic2(ctx,fn,ret_08,ret_08,dt1_06);
  add_intrinsic2(ctx,fn,ret_09,ret_08,dt1_07);
  add_intrinsic2(ctx,fn,dt1_09,ret_08,dt1_08);
  add_intrinsic2(ctx,fn,ret_07,ret_09,dt2_14);
  add_intrinsic2(ctx,fn,ret_08,ret_09,dt2_15);
  add_intrinsic2(ctx,fn,ret_09,ret_09,dt2_16);
  add_intrinsic2(ctx,fn,dt1_09,ret_09,dt2_17);
  add_intrinsic2(ctx,fn,ret_07,dt1_09,ret_07);
  add_intrinsic2(ctx,fn,ret_08,dt1_09,ret_08);
  add_intrinsic2(ctx,fn,ret_09,dt1_09,ret_09);
  add_intrinsic2(ctx,fn,dt1_09,dt1_09,dt1_09);
  add_intrinsic2(ctx,fn,dt2_04,dt2_04,dt2_04);
  add_intrinsic2(ctx,fn,dt1,dt2_04,dt1);
  add_intrinsic2(ctx,fn,dt1_00,dt2_04,dt1_00);
  add_intrinsic2(ctx,fn,ret_03,dt2_04,ret_03);
  add_intrinsic2(ctx,fn,dt2_04,dt1,ret_04);
  add_intrinsic2(ctx,fn,dt1,dt1,ret_05);
  add_intrinsic2(ctx,fn,dt1_00,dt1,dt2_05);
  add_intrinsic2(ctx,fn,ret_03,dt1,dt2_06);
  add_intrinsic2(ctx,fn,dt2_04,dt1_00,dt2_07);
  add_intrinsic2(ctx,fn,dt1,dt1_00,dt2_08);
  add_intrinsic2(ctx,fn,dt1_00,dt1_00,dt2_09);
  add_intrinsic2(ctx,fn,ret_03,dt1_00,dt2_10);
  add_intrinsic2(ctx,fn,dt2_04,ret_03,dt2_11);
  add_intrinsic2(ctx,fn,dt1,ret_03,dt2_12);
  add_intrinsic2(ctx,fn,dt1_00,ret_03,dt2_13);
  add_intrinsic2(ctx,fn,ret_03,ret_03,ret_06);
  add_intrinsic2(ctx,fn,ret_04,ret_04,dt2_04);
  add_intrinsic2(ctx,fn,ret_05,ret_04,dt1);
  add_intrinsic2(ctx,fn,dt2_05,ret_04,dt1_00);
  add_intrinsic2(ctx,fn,dt2_06,ret_04,ret_03);
  add_intrinsic2(ctx,fn,ret_04,ret_05,ret_04);
  add_intrinsic2(ctx,fn,ret_05,ret_05,ret_05);
  add_intrinsic2(ctx,fn,dt2_05,ret_05,dt2_05);
  add_intrinsic2(ctx,fn,dt2_06,ret_05,dt2_06);
  add_intrinsic2(ctx,fn,ret_04,dt2_05,dt2_07);
  add_intrinsic2(ctx,fn,ret_05,dt2_05,dt2_08);
  add_intrinsic2(ctx,fn,dt2_05,dt2_05,dt2_09);
  add_intrinsic2(ctx,fn,dt2_06,dt2_05,dt2_10);
  add_intrinsic2(ctx,fn,ret_04,dt2_06,dt2_11);
  add_intrinsic2(ctx,fn,ret_05,dt2_06,dt2_12);
  add_intrinsic2(ctx,fn,dt2_05,dt2_06,dt2_13);
  add_intrinsic2(ctx,fn,dt2_06,dt2_06,ret_06);
  add_intrinsic2(ctx,fn,dt2_07,dt2_07,dt2_04);
  add_intrinsic2(ctx,fn,dt2_08,dt2_07,dt1);
  add_intrinsic2(ctx,fn,dt2_09,dt2_07,dt1_00);
  add_intrinsic2(ctx,fn,dt2_10,dt2_07,ret_03);
  add_intrinsic2(ctx,fn,dt2_07,dt2_08,ret_04);
  add_intrinsic2(ctx,fn,dt2_08,dt2_08,ret_05);
  add_intrinsic2(ctx,fn,dt2_09,dt2_08,dt2_05);
  add_intrinsic2(ctx,fn,dt2_10,dt2_08,dt2_06);
  add_intrinsic2(ctx,fn,dt2_07,dt2_09,dt2_07);
  add_intrinsic2(ctx,fn,dt2_08,dt2_09,dt2_08);
  add_intrinsic2(ctx,fn,dt2_09,dt2_09,dt2_09);
  add_intrinsic2(ctx,fn,dt2_10,dt2_09,dt2_10);
  add_intrinsic2(ctx,fn,dt2_07,dt2_10,dt2_11);
  add_intrinsic2(ctx,fn,dt2_08,dt2_10,dt2_12);
  add_intrinsic2(ctx,fn,dt2_09,dt2_10,dt2_13);
  add_intrinsic2(ctx,fn,dt2_10,dt2_10,ret_06);
  add_intrinsic2(ctx,fn,dt2_11,dt2_11,dt2_04);
  add_intrinsic2(ctx,fn,dt2_12,dt2_11,dt1);
  add_intrinsic2(ctx,fn,dt2_13,dt2_11,dt1_00);
  add_intrinsic2(ctx,fn,ret_06,dt2_11,ret_03);
  add_intrinsic2(ctx,fn,dt2_11,dt2_12,ret_04);
  add_intrinsic2(ctx,fn,dt2_12,dt2_12,ret_05);
  add_intrinsic2(ctx,fn,dt2_13,dt2_12,dt2_05);
  add_intrinsic2(ctx,fn,ret_06,dt2_12,dt2_06);
  add_intrinsic2(ctx,fn,dt2_11,dt2_13,dt2_07);
  add_intrinsic2(ctx,fn,dt2_12,dt2_13,dt2_08);
  add_intrinsic2(ctx,fn,dt2_13,dt2_13,dt2_09);
  add_intrinsic2(ctx,fn,ret_06,dt2_13,dt2_10);
  add_intrinsic2(ctx,fn,dt2_11,ret_06,dt2_11);
  add_intrinsic2(ctx,fn,dt2_12,ret_06,dt2_12);
  add_intrinsic2(ctx,fn,dt2_13,ret_06,dt2_13);
  add_intrinsic2(ctx,fn,ret_06,ret_06,ret_06);
  return;
}

Assistant:

static void add_intrinsic_mul(Context *ctx, const char *fn)
{
    // mul() is nasty, since there's a bunch of overloads that aren't just
    //  related to vector size.
    // !!! FIXME: needs half, double, uint...
    const MOJOSHADER_astDataType *dtf = &ctx->dt_float;
    const MOJOSHADER_astDataType *dti = &ctx->dt_int;
    const MOJOSHADER_astDataType *f1 = get_usertype(ctx, "float1");
    const MOJOSHADER_astDataType *f2 = get_usertype(ctx, "float2");
    const MOJOSHADER_astDataType *f3 = get_usertype(ctx, "float3");
    const MOJOSHADER_astDataType *f4 = get_usertype(ctx, "float4");
    const MOJOSHADER_astDataType *i1 = get_usertype(ctx, "int1");
    const MOJOSHADER_astDataType *i2 = get_usertype(ctx, "int2");
    const MOJOSHADER_astDataType *i3 = get_usertype(ctx, "int3");
    const MOJOSHADER_astDataType *i4 = get_usertype(ctx, "int4");
    const MOJOSHADER_astDataType *f1x1 = get_usertype(ctx, "float1x1");
    const MOJOSHADER_astDataType *f1x2 = get_usertype(ctx, "float1x2");
    const MOJOSHADER_astDataType *f1x3 = get_usertype(ctx, "float1x3");
    const MOJOSHADER_astDataType *f1x4 = get_usertype(ctx, "float1x4");
    const MOJOSHADER_astDataType *f2x1 = get_usertype(ctx, "float2x1");
    const MOJOSHADER_astDataType *f2x2 = get_usertype(ctx, "float2x2");
    const MOJOSHADER_astDataType *f2x3 = get_usertype(ctx, "float2x3");
    const MOJOSHADER_astDataType *f2x4 = get_usertype(ctx, "float2x4");
    const MOJOSHADER_astDataType *f3x1 = get_usertype(ctx, "float3x1");
    const MOJOSHADER_astDataType *f3x2 = get_usertype(ctx, "float3x2");
    const MOJOSHADER_astDataType *f3x3 = get_usertype(ctx, "float3x3");
    const MOJOSHADER_astDataType *f3x4 = get_usertype(ctx, "float3x4");
    const MOJOSHADER_astDataType *f4x1 = get_usertype(ctx, "float4x1");
    const MOJOSHADER_astDataType *f4x2 = get_usertype(ctx, "float4x2");
    const MOJOSHADER_astDataType *f4x3 = get_usertype(ctx, "float4x3");
    const MOJOSHADER_astDataType *f4x4 = get_usertype(ctx, "float4x4");
    const MOJOSHADER_astDataType *i1x1 = get_usertype(ctx, "int1x1");
    const MOJOSHADER_astDataType *i1x2 = get_usertype(ctx, "int1x2");
    const MOJOSHADER_astDataType *i1x3 = get_usertype(ctx, "int1x3");
    const MOJOSHADER_astDataType *i1x4 = get_usertype(ctx, "int1x4");
    const MOJOSHADER_astDataType *i2x1 = get_usertype(ctx, "int2x1");
    const MOJOSHADER_astDataType *i2x2 = get_usertype(ctx, "int2x2");
    const MOJOSHADER_astDataType *i2x3 = get_usertype(ctx, "int2x3");
    const MOJOSHADER_astDataType *i2x4 = get_usertype(ctx, "int2x4");
    const MOJOSHADER_astDataType *i3x1 = get_usertype(ctx, "int3x1");
    const MOJOSHADER_astDataType *i3x2 = get_usertype(ctx, "int3x2");
    const MOJOSHADER_astDataType *i3x3 = get_usertype(ctx, "int3x3");
    const MOJOSHADER_astDataType *i3x4 = get_usertype(ctx, "int3x4");
    const MOJOSHADER_astDataType *i4x1 = get_usertype(ctx, "int4x1");
    const MOJOSHADER_astDataType *i4x2 = get_usertype(ctx, "int4x2");
    const MOJOSHADER_astDataType *i4x3 = get_usertype(ctx, "int4x3");
    const MOJOSHADER_astDataType *i4x4 = get_usertype(ctx, "int4x4");

    // scalar * scalar
    add_intrinsic2(ctx, fn, dti, dti, dti);
    add_intrinsic2(ctx, fn, dtf, dtf, dtf);

    // scalar * vector
    ADD_INTRINSIC_VECTOR_INT(add_intrinsic2(ctx, fn, dt, dti, dt));
    ADD_INTRINSIC_VECTOR_FLOAT(add_intrinsic2(ctx, fn, dt, dtf, dt));

    // scalar * matrix
    ADD_INTRINSIC_MATRIX_INT(add_intrinsic2(ctx, fn, dt, dti, dt));
    ADD_INTRINSIC_MATRIX_FLOAT(add_intrinsic2(ctx, fn, dt, dtf, dt));

    // vector * scalar
    ADD_INTRINSIC_VECTOR_INT(add_intrinsic2(ctx, fn, dt, dt, dti));
    ADD_INTRINSIC_VECTOR_FLOAT(add_intrinsic2(ctx, fn, dt, dt, dtf));

    // vector * vector
    ADD_INTRINSIC_VECTOR_INT(add_intrinsic2(ctx, fn, dti, dt, dt));
    ADD_INTRINSIC_VECTOR_FLOAT(add_intrinsic2(ctx, fn, dtf, dt, dt));

    // vector * matrix
    add_intrinsic2(ctx, fn, i1, i1, i1x1);
    add_intrinsic2(ctx, fn, i2, i1, i1x2);
    add_intrinsic2(ctx, fn, i3, i1, i1x3);
    add_intrinsic2(ctx, fn, i4, i1, i1x4);
    add_intrinsic2(ctx, fn, i1, i2, i2x1);
    add_intrinsic2(ctx, fn, i2, i2, i2x2);
    add_intrinsic2(ctx, fn, i3, i2, i2x3);
    add_intrinsic2(ctx, fn, i4, i2, i2x4);
    add_intrinsic2(ctx, fn, i1, i3, i3x1);
    add_intrinsic2(ctx, fn, i2, i3, i3x2);
    add_intrinsic2(ctx, fn, i3, i3, i3x3);
    add_intrinsic2(ctx, fn, i4, i3, i3x4);
    add_intrinsic2(ctx, fn, i1, i4, i4x1);
    add_intrinsic2(ctx, fn, i2, i4, i4x2);
    add_intrinsic2(ctx, fn, i3, i4, i4x3);
    add_intrinsic2(ctx, fn, i4, i4, i4x4);
    add_intrinsic2(ctx, fn, f1, f1, f1x1);
    add_intrinsic2(ctx, fn, f2, f1, f1x2);
    add_intrinsic2(ctx, fn, f3, f1, f1x3);
    add_intrinsic2(ctx, fn, f4, f1, f1x4);
    add_intrinsic2(ctx, fn, f1, f2, f2x1);
    add_intrinsic2(ctx, fn, f2, f2, f2x2);
    add_intrinsic2(ctx, fn, f3, f2, f2x3);
    add_intrinsic2(ctx, fn, f4, f2, f2x4);
    add_intrinsic2(ctx, fn, f1, f3, f3x1);
    add_intrinsic2(ctx, fn, f2, f3, f3x2);
    add_intrinsic2(ctx, fn, f3, f3, f3x3);
    add_intrinsic2(ctx, fn, f4, f3, f3x4);
    add_intrinsic2(ctx, fn, f1, f4, f4x1);
    add_intrinsic2(ctx, fn, f2, f4, f4x2);
    add_intrinsic2(ctx, fn, f3, f4, f4x3);
    add_intrinsic2(ctx, fn, f4, f4, f4x4);

    // matrix * scalar
    ADD_INTRINSIC_MATRIX_INT(add_intrinsic2(ctx, fn, dt, dt, dti));
    ADD_INTRINSIC_MATRIX_FLOAT(add_intrinsic2(ctx, fn, dt, dt, dtf));

    // matrix * vector
    add_intrinsic2(ctx, fn, i1, i1x1, i1);
    add_intrinsic2(ctx, fn, i1, i1x2, i2);
    add_intrinsic2(ctx, fn, i1, i1x3, i3);
    add_intrinsic2(ctx, fn, i1, i1x4, i4);
    add_intrinsic2(ctx, fn, i2, i2x1, i1);
    add_intrinsic2(ctx, fn, i2, i2x2, i2);
    add_intrinsic2(ctx, fn, i2, i2x3, i3);
    add_intrinsic2(ctx, fn, i2, i2x4, i4);
    add_intrinsic2(ctx, fn, i3, i3x1, i1);
    add_intrinsic2(ctx, fn, i3, i3x2, i2);
    add_intrinsic2(ctx, fn, i3, i3x3, i3);
    add_intrinsic2(ctx, fn, i3, i3x4, i4);
    add_intrinsic2(ctx, fn, i4, i4x1, i1);
    add_intrinsic2(ctx, fn, i4, i4x2, i2);
    add_intrinsic2(ctx, fn, i4, i4x3, i3);
    add_intrinsic2(ctx, fn, i4, i4x4, i4);
    add_intrinsic2(ctx, fn, f1, f1x1, f1);
    add_intrinsic2(ctx, fn, f1, f1x2, f2);
    add_intrinsic2(ctx, fn, f1, f1x3, f3);
    add_intrinsic2(ctx, fn, f1, f1x4, f4);
    add_intrinsic2(ctx, fn, f2, f2x1, f1);
    add_intrinsic2(ctx, fn, f2, f2x2, f2);
    add_intrinsic2(ctx, fn, f2, f2x3, f3);
    add_intrinsic2(ctx, fn, f2, f2x4, f4);
    add_intrinsic2(ctx, fn, f3, f3x1, f1);
    add_intrinsic2(ctx, fn, f3, f3x2, f2);
    add_intrinsic2(ctx, fn, f3, f3x3, f3);
    add_intrinsic2(ctx, fn, f3, f3x4, f4);
    add_intrinsic2(ctx, fn, f4, f4x1, f1);
    add_intrinsic2(ctx, fn, f4, f4x2, f2);
    add_intrinsic2(ctx, fn, f4, f4x3, f3);
    add_intrinsic2(ctx, fn, f4, f4x4, f4);

    // matrix * matrix
    add_intrinsic2(ctx, fn, i1x1, i1x1, i1x1);
    add_intrinsic2(ctx, fn, i1x2, i1x1, i1x2);
    add_intrinsic2(ctx, fn, i1x3, i1x1, i1x3);
    add_intrinsic2(ctx, fn, i1x4, i1x1, i1x4);
    add_intrinsic2(ctx, fn, i1x1, i1x2, i2x1);
    add_intrinsic2(ctx, fn, i1x2, i1x2, i2x2);
    add_intrinsic2(ctx, fn, i1x3, i1x2, i2x3);
    add_intrinsic2(ctx, fn, i1x4, i1x2, i2x4);
    add_intrinsic2(ctx, fn, i1x1, i1x3, i3x1);
    add_intrinsic2(ctx, fn, i1x2, i1x3, i3x2);
    add_intrinsic2(ctx, fn, i1x3, i1x3, i3x3);
    add_intrinsic2(ctx, fn, i1x4, i1x3, i3x4);
    add_intrinsic2(ctx, fn, i1x1, i1x4, i4x1);
    add_intrinsic2(ctx, fn, i1x2, i1x4, i4x2);
    add_intrinsic2(ctx, fn, i1x3, i1x4, i4x3);
    add_intrinsic2(ctx, fn, i1x4, i1x4, i4x4);
    add_intrinsic2(ctx, fn, i2x1, i2x1, i1x1);
    add_intrinsic2(ctx, fn, i2x2, i2x1, i1x2);
    add_intrinsic2(ctx, fn, i2x3, i2x1, i1x3);
    add_intrinsic2(ctx, fn, i2x4, i2x1, i1x4);
    add_intrinsic2(ctx, fn, i2x1, i2x2, i2x1);
    add_intrinsic2(ctx, fn, i2x2, i2x2, i2x2);
    add_intrinsic2(ctx, fn, i2x3, i2x2, i2x3);
    add_intrinsic2(ctx, fn, i2x4, i2x2, i2x4);
    add_intrinsic2(ctx, fn, i2x1, i2x3, i3x1);
    add_intrinsic2(ctx, fn, i2x2, i2x3, i3x2);
    add_intrinsic2(ctx, fn, i2x3, i2x3, i3x3);
    add_intrinsic2(ctx, fn, i2x4, i2x3, i3x4);
    add_intrinsic2(ctx, fn, i2x1, i2x4, i4x1);
    add_intrinsic2(ctx, fn, i2x2, i2x4, i4x2);
    add_intrinsic2(ctx, fn, i2x3, i2x4, i4x3);
    add_intrinsic2(ctx, fn, i2x4, i2x4, i4x4);
    add_intrinsic2(ctx, fn, i3x1, i3x1, i1x1);
    add_intrinsic2(ctx, fn, i3x2, i3x1, i1x2);
    add_intrinsic2(ctx, fn, i3x3, i3x1, i1x3);
    add_intrinsic2(ctx, fn, i3x4, i3x1, i1x4);
    add_intrinsic2(ctx, fn, i3x1, i3x2, i2x1);
    add_intrinsic2(ctx, fn, i3x2, i3x2, i2x2);
    add_intrinsic2(ctx, fn, i3x3, i3x2, i2x3);
    add_intrinsic2(ctx, fn, i3x4, i3x2, i2x4);
    add_intrinsic2(ctx, fn, i3x1, i3x3, i3x1);
    add_intrinsic2(ctx, fn, i3x2, i3x3, i3x2);
    add_intrinsic2(ctx, fn, i3x3, i3x3, i3x3);
    add_intrinsic2(ctx, fn, i3x4, i3x3, i3x4);
    add_intrinsic2(ctx, fn, i3x1, i3x4, i4x1);
    add_intrinsic2(ctx, fn, i3x2, i3x4, i4x2);
    add_intrinsic2(ctx, fn, i3x3, i3x4, i4x3);
    add_intrinsic2(ctx, fn, i3x4, i3x4, i4x4);
    add_intrinsic2(ctx, fn, i4x1, i4x1, i1x1);
    add_intrinsic2(ctx, fn, i4x2, i4x1, i1x2);
    add_intrinsic2(ctx, fn, i4x3, i4x1, i1x3);
    add_intrinsic2(ctx, fn, i4x4, i4x1, i1x4);
    add_intrinsic2(ctx, fn, i4x1, i4x2, i2x1);
    add_intrinsic2(ctx, fn, i4x2, i4x2, i2x2);
    add_intrinsic2(ctx, fn, i4x3, i4x2, i2x3);
    add_intrinsic2(ctx, fn, i4x4, i4x2, i2x4);
    add_intrinsic2(ctx, fn, i4x1, i4x3, i3x1);
    add_intrinsic2(ctx, fn, i4x2, i4x3, i3x2);
    add_intrinsic2(ctx, fn, i4x3, i4x3, i3x3);
    add_intrinsic2(ctx, fn, i4x4, i4x3, i3x4);
    add_intrinsic2(ctx, fn, i4x1, i4x4, i4x1);
    add_intrinsic2(ctx, fn, i4x2, i4x4, i4x2);
    add_intrinsic2(ctx, fn, i4x3, i4x4, i4x3);
    add_intrinsic2(ctx, fn, i4x4, i4x4, i4x4);
    add_intrinsic2(ctx, fn, f1x1, f1x1, f1x1);
    add_intrinsic2(ctx, fn, f1x2, f1x1, f1x2);
    add_intrinsic2(ctx, fn, f1x3, f1x1, f1x3);
    add_intrinsic2(ctx, fn, f1x4, f1x1, f1x4);
    add_intrinsic2(ctx, fn, f1x1, f1x2, f2x1);
    add_intrinsic2(ctx, fn, f1x2, f1x2, f2x2);
    add_intrinsic2(ctx, fn, f1x3, f1x2, f2x3);
    add_intrinsic2(ctx, fn, f1x4, f1x2, f2x4);
    add_intrinsic2(ctx, fn, f1x1, f1x3, f3x1);
    add_intrinsic2(ctx, fn, f1x2, f1x3, f3x2);
    add_intrinsic2(ctx, fn, f1x3, f1x3, f3x3);
    add_intrinsic2(ctx, fn, f1x4, f1x3, f3x4);
    add_intrinsic2(ctx, fn, f1x1, f1x4, f4x1);
    add_intrinsic2(ctx, fn, f1x2, f1x4, f4x2);
    add_intrinsic2(ctx, fn, f1x3, f1x4, f4x3);
    add_intrinsic2(ctx, fn, f1x4, f1x4, f4x4);
    add_intrinsic2(ctx, fn, f2x1, f2x1, f1x1);
    add_intrinsic2(ctx, fn, f2x2, f2x1, f1x2);
    add_intrinsic2(ctx, fn, f2x3, f2x1, f1x3);
    add_intrinsic2(ctx, fn, f2x4, f2x1, f1x4);
    add_intrinsic2(ctx, fn, f2x1, f2x2, f2x1);
    add_intrinsic2(ctx, fn, f2x2, f2x2, f2x2);
    add_intrinsic2(ctx, fn, f2x3, f2x2, f2x3);
    add_intrinsic2(ctx, fn, f2x4, f2x2, f2x4);
    add_intrinsic2(ctx, fn, f2x1, f2x3, f3x1);
    add_intrinsic2(ctx, fn, f2x2, f2x3, f3x2);
    add_intrinsic2(ctx, fn, f2x3, f2x3, f3x3);
    add_intrinsic2(ctx, fn, f2x4, f2x3, f3x4);
    add_intrinsic2(ctx, fn, f2x1, f2x4, f4x1);
    add_intrinsic2(ctx, fn, f2x2, f2x4, f4x2);
    add_intrinsic2(ctx, fn, f2x3, f2x4, f4x3);
    add_intrinsic2(ctx, fn, f2x4, f2x4, f4x4);
    add_intrinsic2(ctx, fn, f3x1, f3x1, f1x1);
    add_intrinsic2(ctx, fn, f3x2, f3x1, f1x2);
    add_intrinsic2(ctx, fn, f3x3, f3x1, f1x3);
    add_intrinsic2(ctx, fn, f3x4, f3x1, f1x4);
    add_intrinsic2(ctx, fn, f3x1, f3x2, f2x1);
    add_intrinsic2(ctx, fn, f3x2, f3x2, f2x2);
    add_intrinsic2(ctx, fn, f3x3, f3x2, f2x3);
    add_intrinsic2(ctx, fn, f3x4, f3x2, f2x4);
    add_intrinsic2(ctx, fn, f3x1, f3x3, f3x1);
    add_intrinsic2(ctx, fn, f3x2, f3x3, f3x2);
    add_intrinsic2(ctx, fn, f3x3, f3x3, f3x3);
    add_intrinsic2(ctx, fn, f3x4, f3x3, f3x4);
    add_intrinsic2(ctx, fn, f3x1, f3x4, f4x1);
    add_intrinsic2(ctx, fn, f3x2, f3x4, f4x2);
    add_intrinsic2(ctx, fn, f3x3, f3x4, f4x3);
    add_intrinsic2(ctx, fn, f3x4, f3x4, f4x4);
    add_intrinsic2(ctx, fn, f4x1, f4x1, f1x1);
    add_intrinsic2(ctx, fn, f4x2, f4x1, f1x2);
    add_intrinsic2(ctx, fn, f4x3, f4x1, f1x3);
    add_intrinsic2(ctx, fn, f4x4, f4x1, f1x4);
    add_intrinsic2(ctx, fn, f4x1, f4x2, f2x1);
    add_intrinsic2(ctx, fn, f4x2, f4x2, f2x2);
    add_intrinsic2(ctx, fn, f4x3, f4x2, f2x3);
    add_intrinsic2(ctx, fn, f4x4, f4x2, f2x4);
    add_intrinsic2(ctx, fn, f4x1, f4x3, f3x1);
    add_intrinsic2(ctx, fn, f4x2, f4x3, f3x2);
    add_intrinsic2(ctx, fn, f4x3, f4x3, f3x3);
    add_intrinsic2(ctx, fn, f4x4, f4x3, f3x4);
    add_intrinsic2(ctx, fn, f4x1, f4x4, f4x1);
    add_intrinsic2(ctx, fn, f4x2, f4x4, f4x2);
    add_intrinsic2(ctx, fn, f4x3, f4x4, f4x3);
    add_intrinsic2(ctx, fn, f4x4, f4x4, f4x4);
}